

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testNonUpdatablePipelineWithOneUpdatableModel(void)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_1b0 [80];
  undefined1 local_160 [84];
  undefined4 local_10c;
  Result local_108;
  Model *m4;
  Model *m3;
  Model *m2;
  Model *m1;
  Pipeline *pipeline;
  TensorAttributes tensorAttributesD;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesB;
  TensorAttributes tensorAttributesA;
  undefined1 local_68 [48];
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)(local_68 + 0x28));
  CoreML::Result::Result((Result *)local_68);
  tensorAttributesB._8_8_ = anon_var_dwarf_248cf;
  tensorAttributesC._8_8_ = (long)"RGB" + 2;
  tensorAttributesB.name = (char *)0x1;
  tensorAttributesD._8_8_ = (long)"LOC" + 2;
  tensorAttributesC.name = (char *)0x1;
  pipeline = (Pipeline *)0x46d27f;
  tensorAttributesD.name = (char *)0x3;
  m1 = (Model *)buildEmptyPipelineModelWithStringOutput
                          ((Model *)(local_68 + 0x28),false,
                           (TensorAttributes *)&tensorAttributesB.dimension,"E");
  m2 = CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  m3 = CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  m4 = CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  local_108.m_message._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  buildBasicNeuralNetworkModel
            (m2,false,(TensorAttributes *)&tensorAttributesB.dimension,
             (TensorAttributes *)&tensorAttributesC.dimension,1,false,false);
  buildBasicNeuralNetworkModel
            (m3,false,(TensorAttributes *)&tensorAttributesC.dimension,
             (TensorAttributes *)&tensorAttributesD.dimension,1,false,false);
  buildBasicNeuralNetworkModel
            (m4,false,(TensorAttributes *)&tensorAttributesD.dimension,(TensorAttributes *)&pipeline
             ,1,false,false);
  buildBasicNearestNeighborClassifier
            ((Model *)local_108.m_message._M_storage._M_storage,true,(TensorAttributes *)&pipeline,
             "E");
  CoreML::Model::validate(&local_108,m2);
  CoreML::Result::operator=((Result *)local_68,&local_108);
  CoreML::Result::~Result(&local_108);
  bVar1 = CoreML::Result::good((Result *)local_68);
  if (bVar1) {
    CoreML::Model::validate((Result *)(local_160 + 0x28),m3);
    CoreML::Result::operator=((Result *)local_68,(Result *)(local_160 + 0x28));
    CoreML::Result::~Result((Result *)(local_160 + 0x28));
    bVar1 = CoreML::Result::good((Result *)local_68);
    if (bVar1) {
      CoreML::Model::validate((Result *)local_160,m4);
      CoreML::Result::operator=((Result *)local_68,(Result *)local_160);
      CoreML::Result::~Result((Result *)local_160);
      bVar1 = CoreML::Result::good((Result *)local_68);
      if (bVar1) {
        CoreML::Model::validate
                  ((Result *)(local_1b0 + 0x28),(Model *)local_108.m_message._M_storage._M_storage);
        CoreML::Result::operator=((Result *)local_68,(Result *)(local_1b0 + 0x28));
        CoreML::Result::~Result((Result *)(local_1b0 + 0x28));
        bVar1 = CoreML::Result::good((Result *)local_68);
        if (bVar1) {
          CoreML::Model::validate((Result *)local_1b0,(Model *)(local_68 + 0x28));
          CoreML::Result::operator=((Result *)local_68,(Result *)local_1b0);
          CoreML::Result::~Result((Result *)local_1b0);
          bVar1 = CoreML::Result::good((Result *)local_68);
          if (bVar1) {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x464);
            poVar2 = std::operator<<(poVar2,": error: ");
            poVar2 = std::operator<<(poVar2,"!((res).good())");
            poVar2 = std::operator<<(poVar2," was false, expected true.");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            spec._oneof_case_[0] = 1;
          }
          else {
            spec._oneof_case_[0] = 0;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x460);
          poVar2 = std::operator<<(poVar2,": error: ");
          poVar2 = std::operator<<(poVar2,"(res).good()");
          poVar2 = std::operator<<(poVar2," was false, expected true.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          spec._oneof_case_[0] = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x45d);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"(res).good()");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        spec._oneof_case_[0] = 1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x45a);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(res).good()");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      spec._oneof_case_[0] = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x457);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(res).good()");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    spec._oneof_case_[0] = 1;
  }
  local_10c = 1;
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)(local_68 + 0x28));
  return spec._oneof_case_[0];
}

Assistant:

int testNonUpdatablePipelineWithOneUpdatableModel() {

    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline = buildEmptyPipelineModelWithStringOutput(spec, false, &tensorAttributesA, "E");

    auto m1 = pipeline->add_models();
    auto m2 = pipeline->add_models();
    auto m3 = pipeline->add_models();
    auto m4 = pipeline->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    (void)buildBasicNeuralNetworkModel(*m2, false, &tensorAttributesB, &tensorAttributesC);
    (void)buildBasicNeuralNetworkModel(*m3, false, &tensorAttributesC, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m4, true, &tensorAttributesD, "E");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    // expect validation to fail due to presence of uptable model in non-updatable pipeline.
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    return 0;
}